

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptWeakMap.cpp
# Opt level: O2

void __thiscall
Js::JavascriptWeakMap::ExtractSnapObjectDataInto
          (JavascriptWeakMap *this,SnapObject *objData,SlabAllocator *alloc)

{
  RecyclableObject *key;
  code *pcVar1;
  int i;
  undefined4 *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  JavascriptWeakMap *pJVar6;
  Type *pTVar7;
  uint uVar8;
  undefined **this_00;
  Var pvVar9;
  ulong uVar10;
  int last;
  void *local_90;
  JavascriptWeakMap *local_88;
  void *local_80;
  Var local_78;
  undefined4 *local_70;
  SnapObject *local_68;
  Var local_60;
  Var value;
  ulong local_50;
  uint local_44;
  JavascriptWeakMap *local_40;
  JavascriptWeakMap *local_38;
  
  local_68 = objData;
  pJVar6 = (JavascriptWeakMap *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<16ul>(alloc);
  local_88 = (JavascriptWeakMap *)&this->keySet;
  (**(this->keySet).
     super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
     .super_IWeakReferenceDictionary._vptr_IWeakReferenceDictionary)();
  iVar4 = (this->keySet).
          super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          .count - (this->keySet).
                   super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                   .freeCount;
  *(undefined4 *)
   &(pJVar6->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
  local_50 = (ulong)(iVar4 * 2 + 1);
  local_44 = iVar4 * 2;
  value = alloc;
  pTVar7 = (Type *)TTD::SlabAllocatorBase<0>::SlabReserveArraySpace<void*>(alloc,local_50);
  (pJVar6->super_DynamicObject).super_RecyclableObject.type.ptr = pTVar7;
  local_80 = (void *)((ulong)this | 1);
  this_00 = &PTR_013e5f18;
  local_38 = pJVar6;
  local_70 = (undefined4 *)__tls_get_addr();
  uVar10 = 0;
  local_40 = this;
  do {
    pJVar6 = local_38;
    if ((this->keySet).
        super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
        .bucketCount <= uVar10) {
      uVar10 = (ulong)*(uint *)&(local_38->super_DynamicObject).super_RecyclableObject.
                                super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject;
      if (uVar10 == 0) {
        (local_38->super_DynamicObject).super_RecyclableObject.type.ptr = (Type *)0x0;
        TTD::SlabAllocatorBase<0>::SlabAbortArraySpace<void*>
                  ((SlabAllocatorBase<0> *)value,local_50);
      }
      else {
        TTD::SlabAllocatorBase<0>::SlabCommitArraySpace<void*>
                  ((SlabAllocatorBase<0> *)value,uVar10,local_50);
      }
      TTD::NSSnapObjects::
      SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapMapInfo*,(TTD::NSSnapObjects::SnapObjectType)26>
                (local_68,(SnapMapInfo *)pJVar6);
      return;
    }
    iVar4 = (this->keySet).
            super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            .buckets.ptr[uVar10];
    if (iVar4 != -1) {
      last = -1;
      while (i = iVar4, i != -1) {
        key = (this->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .weakRefs.ptr[i].ptr;
        if (key == (RecyclableObject *)0x0) {
          iVar4 = (this->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          this_00 = (undefined **)local_88;
          JsUtil::
          SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          ::RemoveAt((SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                      *)local_88,i,last,(uint)uVar10);
          this = local_40;
        }
        else {
          local_60 = (Var)0x0;
          pJVar6 = (JavascriptWeakMap *)GetWeakMapKeyMapFromKey((JavascriptWeakMap *)this_00,key);
          if (pJVar6 != (JavascriptWeakMap *)0x0) {
            local_90 = local_80;
            this_00 = (undefined **)pJVar6;
            bVar3 = JsUtil::
                    BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::ContainsKey((BaseDictionary<void_*,_void_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                   *)pJVar6,&local_90);
            if (bVar3) {
              KeyMapGet(local_40,(WeakMapKeyMap *)pJVar6,&local_60);
              uVar5 = *(uint *)&(local_38->super_DynamicObject).super_RecyclableObject.
                                super_FinalizableObject.super_IRecyclerVisitedObject.
                                _vptr_IRecyclerVisitedObject;
              uVar8 = uVar5 + 1;
              pvVar9 = local_60;
              if (local_44 <= uVar8) {
                local_78 = local_60;
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar2 = local_70;
                *local_70 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptWeakMap.cpp"
                                            ,0x1a0,"(smi->MapSize + 1 < mapCountEst)",
                                            "We are writing junk");
                if (!bVar3) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                *puVar2 = 0;
                uVar5 = *(uint *)&(local_38->super_DynamicObject).super_RecyclableObject.
                                  super_FinalizableObject.super_IRecyclerVisitedObject.
                                  _vptr_IRecyclerVisitedObject;
                uVar8 = uVar5 + 1;
                pvVar9 = local_78;
              }
              *(RecyclableObject **)
               (&((local_38->super_DynamicObject).super_RecyclableObject.type.ptr)->typeId +
               (ulong)uVar5 * 2) = key;
              *(Var *)(&((local_38->super_DynamicObject).super_RecyclableObject.type.ptr)->typeId +
                      (ulong)uVar8 * 2) = pvVar9;
              *(uint *)&(local_38->super_DynamicObject).super_RecyclableObject.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject = uVar5 + 2;
              this_00 = (undefined **)local_38;
            }
          }
          this = local_40;
          iVar4 = (local_40->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          last = i;
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void JavascriptWeakMap::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapMapInfo* smi = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapMapInfo>();
        uint32 mapCountEst = this->Size() * 2;

        smi->MapSize = 0;
        smi->MapKeyValueArray = alloc.SlabReserveArraySpace<TTD::TTDVar>(mapCountEst + 1); //always reserve at least 1 element

        this->Map([&](RecyclableObject* key, Js::Var value)
        {
            AssertMsg(smi->MapSize + 1 < mapCountEst, "We are writing junk");

            smi->MapKeyValueArray[smi->MapSize] = key;
            smi->MapKeyValueArray[smi->MapSize + 1] = value;
            smi->MapSize += 2;
        });

        if(smi->MapSize == 0)
        {
            smi->MapKeyValueArray = nullptr;
            alloc.SlabAbortArraySpace<TTD::TTDVar>(mapCountEst + 1);
        }
        else
        {
            alloc.SlabCommitArraySpace<TTD::TTDVar>(smi->MapSize, mapCountEst + 1);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapMapInfo*, TTD::NSSnapObjects::SnapObjectType::SnapMapObject>(objData, smi);
    }